

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               AvgState<duckdb::hugeint_t> **states,SelectionVector *isel,SelectionVector *ssel,
               ValidityMask *mask,idx_t count)

{
  bool bVar1;
  ulong uVar2;
  AggregateUnaryInput *pAVar3;
  idx_t i;
  idx_t iVar4;
  idx_t i_1;
  ulong uVar5;
  idx_t iVar6;
  hugeint_t local_48;
  idx_t local_38;
  
  local_48.lower = (uint64_t)aggr_input_data;
  local_48.upper = (int64_t)mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      local_38 = uVar5;
      if (isel->sel_vector != (sel_t *)0x0) {
        local_38 = (idx_t)isel->sel_vector[uVar5];
      }
      pAVar3 = (AggregateUnaryInput *)ssel->sel_vector;
      uVar2 = uVar5;
      if (pAVar3 != (AggregateUnaryInput *)0x0) {
        uVar2 = (ulong)*(uint *)((long)&pAVar3->input + uVar5 * 4);
      }
      BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
      Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)states[uVar2],
                 (AvgState<duckdb::hugeint_t> *)(idata + local_38),&local_48,pAVar3);
    }
  }
  else {
    pAVar3 = (AggregateUnaryInput *)isel;
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      local_38 = iVar4;
      if (isel->sel_vector != (sel_t *)0x0) {
        local_38 = (idx_t)isel->sel_vector[iVar4];
      }
      iVar6 = iVar4;
      if (ssel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)ssel->sel_vector[iVar4];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,local_38);
      if (bVar1) {
        BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
        Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                  ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)states[iVar6]
                   ,(AvgState<duckdb::hugeint_t> *)(idata + local_38),&local_48,pAVar3);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}